

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr6r700sixx.cpp
# Opt level: O0

CheckValue<double> IKPowWithIntegerCheck<double>(double f,int n)

{
  ulong in_RAX;
  CheckValue<double> CVar1;
  uint local_2c;
  uint local_28;
  int num;
  int n_local;
  double f_local;
  CheckValue<double> ret;
  
  ret.value._0_1_ = 1;
  if (n == 0) {
    f_local = 1.0;
  }
  else {
    f_local = f;
    if (n != 1) {
      if (n < 0) {
        if ((f == 0.0) && (!NAN(f))) {
          ret.value._0_1_ = 0;
          f_local = 1e+30;
          goto LAB_0014951f;
        }
        if (n == -1) {
          f_local = 1.0 / f;
          goto LAB_0014951f;
        }
      }
      local_2c = n;
      if (n < 1) {
        local_2c = -n;
      }
      in_RAX = (ulong)local_2c;
      local_28 = local_2c;
      if (local_2c == 2) {
        f_local = f * f;
      }
      else if (local_2c == 3) {
        f_local = f * f * f;
      }
      else {
        f_local = 1.0;
        _num = f;
        while (0 < (int)local_28) {
          if ((local_28 & 1) != 0) {
            f_local = _num * f_local;
          }
          local_28 = (int)local_28 >> 1;
          in_RAX = (ulong)local_28;
          _num = _num * _num;
        }
      }
      if (n < 0) {
        f_local = 1.0 / f_local;
      }
    }
  }
LAB_0014951f:
  CVar1._9_7_ = (undefined7)(in_RAX >> 8);
  CVar1.valid = (bool)ret.value._0_1_;
  CVar1.value = f_local;
  return CVar1;
}

Assistant:

inline CheckValue<T> IKPowWithIntegerCheck(T f, int n)
{
    CheckValue<T> ret;
    ret.valid = true;
    if( n == 0 ) {
        ret.value = 1.0;
        return ret;
    }
    else if( n == 1 )
    {
        ret.value = f;
        return ret;
    }
    else if( n < 0 )
    {
        if( f == 0 )
        {
            ret.valid = false;
            ret.value = (T)1.0e30;
            return ret;
        }
        if( n == -1 ) {
            ret.value = T(1.0)/f;
            return ret;
        }
    }

    int num = n > 0 ? n : -n;
    if( num == 2 ) {
        ret.value = f*f;
    }
    else if( num == 3 ) {
        ret.value = f*f*f;
    }
    else {
        ret.value = 1.0;
        while(num>0) {
            if( num & 1 ) {
                ret.value *= f;
            }
            num >>= 1;
            f *= f;
        }
    }
    
    if( n < 0 ) {
        ret.value = T(1.0)/ret.value;
    }
    return ret;
}